

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UObject * __thiscall
icu_63::SimpleFactory::create
          (SimpleFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_70 [8];
  UnicodeString temp;
  UErrorCode *status_local;
  ICUService *service_local;
  ICUServiceKey *key_local;
  SimpleFactory *this_local;
  
  temp.fUnion._48_8_ = status;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_70);
    iVar2 = (*(key->super_UObject)._vptr_UObject[5])(key,(UnicodeString *)local_70);
    UVar1 = UnicodeString::operator==(&this->_id,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    if (UVar1 != '\0') {
      iVar2 = (*(service->super_ICUNotifier)._vptr_ICUNotifier[0xe])(service,this->_instance);
      this_local = (SimpleFactory *)CONCAT44(extraout_var_00,iVar2);
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_70);
    if (UVar1 != '\0') {
      return (UObject *)this_local;
    }
  }
  return (UObject *)0x0;
}

Assistant:

UObject* 
SimpleFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const 
{
    if (U_SUCCESS(status)) {
        UnicodeString temp;
        if (_id == key.currentID(temp)) {
            return service->cloneInstance(_instance); 
        }
    }
    return NULL;
}